

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr_test.cpp
# Opt level: O0

void __thiscall
TaggedPointer_Dispatch_Test::~TaggedPointer_Dispatch_Test(TaggedPointer_Dispatch_Test *this)

{
  void *in_RDI;
  
  ~TaggedPointer_Dispatch_Test((TaggedPointer_Dispatch_Test *)0x66eee8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(TaggedPointer, Dispatch) {
    IntType<0> it0;
    Handle h0(&it0);
    ASSERT_EQ(0, it0.func());
    EXPECT_EQ(0, h0.func());
    ASSERT_EQ(0, it0.cfunc());
    EXPECT_EQ(0, h0.cfunc());

    IntType<1> it1;
    Handle h1(&it1);
    ASSERT_EQ(1, it1.func());
    EXPECT_EQ(1, h1.func());
    ASSERT_EQ(1, it1.cfunc());
    EXPECT_EQ(1, h1.cfunc());

    IntType<2> it2;
    Handle h2(&it2);
    ASSERT_EQ(2, it2.func());
    EXPECT_EQ(2, h2.func());
    ASSERT_EQ(2, it2.cfunc());
    EXPECT_EQ(2, h2.cfunc());

    IntType<3> it3;
    Handle h3(&it3);
    ASSERT_EQ(3, it3.func());
    EXPECT_EQ(3, h3.func());
    ASSERT_EQ(3, it3.cfunc());
    EXPECT_EQ(3, h3.cfunc());

    IntType<4> it4;
    Handle h4(&it4);
    ASSERT_EQ(4, it4.func());
    EXPECT_EQ(4, h4.func());
    ASSERT_EQ(4, it4.cfunc());
    EXPECT_EQ(4, h4.cfunc());

    IntType<5> it5;
    Handle h5(&it5);
    ASSERT_EQ(5, it5.func());
    EXPECT_EQ(5, h5.func());
    ASSERT_EQ(5, it5.cfunc());
    EXPECT_EQ(5, h5.cfunc());

    IntType<6> it6;
    Handle h6(&it6);
    ASSERT_EQ(6, it6.func());
    EXPECT_EQ(6, h6.func());
    ASSERT_EQ(6, it6.cfunc());
    EXPECT_EQ(6, h6.cfunc());

    IntType<7> it7;
    Handle h7(&it7);
    ASSERT_EQ(7, it7.func());
    EXPECT_EQ(7, h7.func());
    ASSERT_EQ(7, it7.cfunc());
    EXPECT_EQ(7, h7.cfunc());

    IntType<8> it8;
    Handle h8(&it8);
    ASSERT_EQ(8, it8.func());
    EXPECT_EQ(8, h8.func());
    ASSERT_EQ(8, it8.cfunc());
    EXPECT_EQ(8, h8.cfunc());

    IntType<9> it9;
    Handle h9(&it9);
    ASSERT_EQ(9, it9.func());
    EXPECT_EQ(9, h9.func());
    ASSERT_EQ(9, it9.cfunc());
    EXPECT_EQ(9, h9.cfunc());

    IntType<10> it10;
    Handle h10(&it10);
    ASSERT_EQ(10, it10.func());
    EXPECT_EQ(10, h10.func());
    ASSERT_EQ(10, it10.cfunc());
    EXPECT_EQ(10, h10.cfunc());

    IntType<11> it11;
    Handle h11(&it11);
    ASSERT_EQ(11, it11.func());
    EXPECT_EQ(11, h11.func());
    ASSERT_EQ(11, it11.cfunc());
    EXPECT_EQ(11, h11.cfunc());

    IntType<12> it12;
    Handle h12(&it12);
    ASSERT_EQ(12, it12.func());
    EXPECT_EQ(12, h12.func());
    ASSERT_EQ(12, it12.cfunc());
    EXPECT_EQ(12, h12.cfunc());

    IntType<13> it13;
    Handle h13(&it13);
    ASSERT_EQ(13, it13.func());
    EXPECT_EQ(13, h13.func());
    ASSERT_EQ(13, it13.cfunc());
    EXPECT_EQ(13, h13.cfunc());

    IntType<14> it14;
    Handle h14(&it14);
    ASSERT_EQ(14, it14.func());
    EXPECT_EQ(14, h14.func());
    ASSERT_EQ(14, it14.cfunc());
    EXPECT_EQ(14, h14.cfunc());
}